

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayObjectTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::VertexArrayObjectTest::render
          (VertexArrayObjectTest *this,Surface *vaoResult,Surface *defaultResult)

{
  GLenum GVar1;
  deBool dVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  PixelBufferAccess local_78;
  PixelBufferAccess local_50;
  GLuint local_24;
  Surface *pSStack_20;
  GLuint vao;
  Surface *defaultResult_local;
  Surface *vaoResult_local;
  VertexArrayObjectTest *this_local;
  
  local_24 = 0;
  pSStack_20 = defaultResult;
  defaultResult_local = vaoResult;
  vaoResult_local = (Surface *)this;
  do {
    glwGenVertexArrays(1,&local_24);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glGenVertexArrays(1, &vao)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                    ,0x25a);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    glwBindVertexArray(local_24);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glBindVertexArray(vao)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                    ,0x25b);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  setState(this,&(this->m_spec).vao);
  do {
    glwBindVertexArray(0);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glBindVertexArray(0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                    ,0x25d);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  setState(this,&(this->m_spec).state);
  do {
    glwBindVertexArray(local_24);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glBindVertexArray(vao)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                    ,0x261);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar3 = glu::ShaderProgram::getProgram(this->m_vaoProgram);
    glwUseProgram(dVar3);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glUseProgram(m_vaoProgram->getProgram())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                    ,0x262);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  makeDrawCall(this,&(this->m_spec).vao);
  pRVar4 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess(&local_50,defaultResult_local);
  glu::readPixels(pRVar4,0,0,&local_50);
  setState(this,&(this->m_spec).vao);
  do {
    glwBindVertexArray(0);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glBindVertexArray(0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                    ,0x266);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    dVar3 = glu::ShaderProgram::getProgram(this->m_stateProgram);
    glwUseProgram(dVar3);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glUseProgram(m_stateProgram->getProgram())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                    ,0x268);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  makeDrawCall(this,&(this->m_spec).state);
  pRVar4 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess(&local_78,pSStack_20);
  glu::readPixels(pRVar4,0,0,&local_78);
  return;
}

Assistant:

void VertexArrayObjectTest::render (tcu::Surface& vaoResult, tcu::Surface& defaultResult)
{
	GLuint vao = 0;

	GLU_CHECK_CALL(glGenVertexArrays(1, &vao));
	GLU_CHECK_CALL(glBindVertexArray(vao));
	setState(m_spec.vao);
	GLU_CHECK_CALL(glBindVertexArray(0));

	setState(m_spec.state);

	GLU_CHECK_CALL(glBindVertexArray(vao));
	GLU_CHECK_CALL(glUseProgram(m_vaoProgram->getProgram()));
	makeDrawCall(m_spec.vao);
	glu::readPixels(m_context.getRenderContext(), 0, 0, vaoResult.getAccess());
	setState(m_spec.vao);
	GLU_CHECK_CALL(glBindVertexArray(0));

	GLU_CHECK_CALL(glUseProgram(m_stateProgram->getProgram()));
	makeDrawCall(m_spec.state);
	glu::readPixels(m_context.getRenderContext(), 0, 0, defaultResult.getAccess());
}